

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

string * __thiscall
duckdb::DecimalStatsUnifier<int>::StatsToString(DecimalStatsUnifier<int> *this,string *stats)

{
  ulong uVar1;
  char *src;
  const_data_ptr_t ptr;
  long in_RSI;
  string *in_RDI;
  int numeric_val;
  Value local_60 [68];
  int local_1c;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    src = (char *)std::__cxx11::string::data();
    ptr = const_data_ptr_cast<char>(src);
    local_1c = Load<int>(ptr);
    duckdb::Value::DECIMAL((int)local_60,(uchar)local_1c,*(uchar *)(in_RSI + 0x82));
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::Value::~Value(local_60);
  }
  else {
    std::__cxx11::string::string(in_RDI);
  }
  return in_RDI;
}

Assistant:

string StatsToString(const string &stats) override {
		if (stats.empty()) {
			return string();
		}
		auto numeric_val = Load<T>(const_data_ptr_cast(stats.data()));
		return Value::DECIMAL(numeric_val, width, scale).ToString();
	}